

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::Message(char *m1,char *title)

{
  ostream *this;
  void *this_00;
  char *title_local;
  char *m1_local;
  
  if (!s_DisableMessages) {
    if (s_MessageCallback == (MessageCallback)0x0) {
      this = std::operator<<((ostream *)&std::cerr,m1);
      this_00 = (void *)std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
    }
    else {
      (*s_MessageCallback)(m1,title,&s_DisableMessages,s_MessageCallbackClientData);
    }
  }
  return;
}

Assistant:

void cmSystemTools::Message(const char* m1, const char* title)
{
  if (s_DisableMessages) {
    return;
  }
  if (s_MessageCallback) {
    (*s_MessageCallback)(m1, title, s_DisableMessages,
                         s_MessageCallbackClientData);
    return;
  }
  std::cerr << m1 << std::endl << std::flush;
}